

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::keep_alive(socket_t sock,time_t keep_alive_timeout_sec)

{
  duration<long,_std::ratio<1L,_1000L>_> *__rtime;
  rep rVar1;
  long in_RSI;
  time_t timeout;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> duration;
  time_point current;
  ssize_t val;
  time_point start;
  time_t in_stack_00000078;
  time_t in_stack_00000080;
  socket_t in_stack_0000008c;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb8;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  undefined8 local_28;
  
  std::chrono::_V2::steady_clock::now();
  while( true ) {
    __rtime = (duration<long,_std::ratio<1L,_1000L>_> *)
              select_read(in_stack_0000008c,in_stack_00000080,in_stack_00000078);
    if ((long)__rtime < 0) {
      return false;
    }
    if (__rtime != (duration<long,_std::ratio<1L,_1000L>_> *)0x0) break;
    local_28 = std::chrono::_V2::steady_clock::now();
    std::chrono::operator-
              (in_stack_ffffffffffffffb8,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_30.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffffa8);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
    if (in_RSI * 1000 < rVar1) {
      return false;
    }
    in_stack_ffffffffffffffb4 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffb8,
               (int *)&stack0xffffffffffffffb4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(__rtime);
  }
  return true;
}

Assistant:

inline bool keep_alive(socket_t sock, time_t keep_alive_timeout_sec) {
  using namespace std::chrono;
  auto start = steady_clock::now();
  while (true) {
    auto val = select_read(sock, 0, 10000);
    if (val < 0) {
      return false;
    } else if (val == 0) {
      auto current = steady_clock::now();
      auto duration = duration_cast<milliseconds>(current - start);
      auto timeout = keep_alive_timeout_sec * 1000;
      if (duration.count() > timeout) { return false; }
      std::this_thread::sleep_for(std::chrono::milliseconds(1));
    } else {
      return true;
    }
  }
}